

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O0

void __thiscall
ctemplate::PreEscape::Modify
          (PreEscape *this,char *in,size_t inlen,PerExpandData *param_3,ExpandEmitter *out,
          string *arg)

{
  char *limit;
  char *start;
  char *pos;
  string *arg_local;
  ExpandEmitter *out_local;
  PerExpandData *param_3_local;
  size_t inlen_local;
  char *in_local;
  PreEscape *this_local;
  
  limit = in;
  start = in;
LAB_0017691c:
  do {
    if (in + inlen <= start) {
      EmitRun(limit,start,out);
      return;
    }
    switch(*start) {
    case '\"':
      EmitRun(limit,start,out);
      (*out->_vptr_ExpandEmitter[5])(out,"&quot;",6);
      break;
    default:
      goto switchD_00176951_caseD_23;
    case '&':
      EmitRun(limit,start,out);
      (*out->_vptr_ExpandEmitter[5])(out,"&amp;",5);
      break;
    case '\'':
      EmitRun(limit,start,out);
      (*out->_vptr_ExpandEmitter[5])(out,"&#39;",5);
      break;
    case '<':
      EmitRun(limit,start,out);
      (*out->_vptr_ExpandEmitter[5])(out,"&lt;",4);
      break;
    case '>':
      EmitRun(limit,start,out);
      (*out->_vptr_ExpandEmitter[5])(out,"&gt;",4);
    }
    limit = start + 1;
    start = limit;
  } while( true );
switchD_00176951_caseD_23:
  start = start + 1;
  goto LAB_0017691c;
}

Assistant:

void PreEscape::Modify(const char* in, size_t inlen,
                       const PerExpandData*,
                       ExpandEmitter* out, const string& arg) const {
  const char* pos = in;
  const char* start = pos;
  const char* const limit = in + inlen;
  while (pos < limit)  {
    switch (*pos) {
      default:
        // Increment our counter and look at the next character.
        ++pos;
        continue;

      // Unlike HtmlEscape, we leave whitespace as is.
      case '&':  EmitRun(start, pos, out); APPEND("&amp;");  break;
      case '"':  EmitRun(start, pos, out); APPEND("&quot;"); break;
      case '\'': EmitRun(start, pos, out); APPEND("&#39;");  break;
      case '<':  EmitRun(start, pos, out); APPEND("&lt;");   break;
      case '>':  EmitRun(start, pos, out); APPEND("&gt;");   break;
    }
    start = ++pos;
  }
  EmitRun(start, pos, out);
}